

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_19cdc37::ResizeRealtimeTest_TestInternalResizeSetScaleMode3_Test::TestBody
          (ResizeRealtimeTest_TestInternalResizeSetScaleMode3_Test *this)

{
  EncoderTest *pEVar1;
  undefined8 *puVar2;
  bool bVar3;
  pointer *__ptr;
  SEARCH_METHODS *pSVar4;
  pointer pFVar5;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  uint expected_w;
  Y4mVideoSource video;
  AssertHelper local_148;
  AssertHelper local_140;
  undefined1 local_138 [16];
  long local_128 [2];
  uint local_118 [2];
  pointer local_110;
  Y4mVideoSource local_108;
  
  local_138._0_8_ = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"niklas_1280_720_30.y4m","");
  libaom_test::Y4mVideoSource::Y4mVideoSource(&local_108,(string *)local_138,0,0x3c);
  if ((long *)local_138._0_8_ != local_128) {
    operator_delete((void *)local_138._0_8_);
  }
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.g_w = 0x500;
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.g_h = 0x2d0;
  (this->super_ResizeRealtimeTest).set_scale_mode_ = false;
  (this->super_ResizeRealtimeTest).set_scale_mode2_ = false;
  (this->super_ResizeRealtimeTest).set_scale_mode3_ = true;
  ResizeRealtimeTest::DefaultConfig(&this->super_ResizeRealtimeTest);
  (this->super_ResizeRealtimeTest).change_bitrate_ = false;
  (this->super_ResizeRealtimeTest).mismatch_nframes_ = 0;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_138);
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      pEVar1 = &(this->super_ResizeRealtimeTest).super_EncoderTest;
      (*pEVar1->_vptr_EncoderTest[2])(pEVar1,&local_108);
    }
    bVar3 = local_138[8];
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_138);
    if (bVar3 == false) {
      local_148.data_ =
           (AssertHelperData *)
           ((long)(this->super_ResizeRealtimeTest).frame_info_list_.
                  super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->super_ResizeRealtimeTest).frame_info_list_.
                  super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4);
      local_140.data_._0_4_ = local_108.limit_;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                ((internal *)local_138,"frame_info_list_.size()","video.limit()",
                 (unsigned_long *)&local_148,(uint *)&local_140);
      if (local_138[0] == (string)0x0) {
        testing::Message::Message((Message *)&local_148);
        if ((undefined8 *)CONCAT71(local_138._9_7_,local_138[8]) == (undefined8 *)0x0) {
          pSVar4 = "";
        }
        else {
          pSVar4 = *(SEARCH_METHODS **)CONCAT71(local_138._9_7_,local_138[8]);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_140,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                   ,0x2d8,(char *)pSVar4);
        testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_148);
        testing::internal::AssertHelper::~AssertHelper(&local_140);
        if (local_148.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_148.data_ + 8))();
        }
        puVar2 = (undefined8 *)CONCAT71(local_138._9_7_,local_138[8]);
        if (puVar2 != (undefined8 *)0x0) {
          if ((undefined8 *)*puVar2 != puVar2 + 2) {
            operator_delete((undefined8 *)*puVar2);
          }
          operator_delete(puVar2);
        }
      }
      else {
        puVar2 = (undefined8 *)CONCAT71(local_138._9_7_,local_138[8]);
        if (puVar2 != (undefined8 *)0x0) {
          if ((undefined8 *)*puVar2 != puVar2 + 2) {
            operator_delete((undefined8 *)*puVar2);
          }
          operator_delete(puVar2);
        }
        pFVar5 = (this->super_ResizeRealtimeTest).frame_info_list_.
                 super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_110 = (this->super_ResizeRealtimeTest).frame_info_list_.
                    super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        if (pFVar5 != local_110) {
          do {
            local_118[0] = 0x280;
            local_118[1] = 0x2d0;
            if (0x1e < (uint)pFVar5->pts) {
              local_118[0] = 0x500;
            }
            testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                      ((internal *)local_138,"expected_w","info.w",local_118,&pFVar5->w);
            if (local_138[0] == (string)0x0) {
              testing::Message::Message((Message *)&local_148);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&(local_148.data_)->line,"Frame ",6);
              std::ostream::_M_insert<unsigned_long>((ulong)&(local_148.data_)->line);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&(local_148.data_)->line," had unexpected width",0x15);
              pSVar4 = "";
              if ((undefined8 *)CONCAT71(local_138._9_7_,local_138[8]) != (undefined8 *)0x0) {
                pSVar4 = *(SEARCH_METHODS **)CONCAT71(local_138._9_7_,local_138[8]);
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_140,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                         ,0x2e1,(char *)pSVar4);
              testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_148);
              testing::internal::AssertHelper::~AssertHelper(&local_140);
              if (local_148.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_148.data_ + 8))();
              }
            }
            puVar2 = (undefined8 *)CONCAT71(local_138._9_7_,local_138[8]);
            if (puVar2 != (undefined8 *)0x0) {
              if ((undefined8 *)*puVar2 != puVar2 + 2) {
                operator_delete((undefined8 *)*puVar2);
              }
              operator_delete(puVar2);
            }
            testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                      ((internal *)local_138,"expected_h","info.h",local_118 + 1,&pFVar5->h);
            if (local_138[0] == (string)0x0) {
              testing::Message::Message((Message *)&local_148);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&(local_148.data_)->line,"Frame ",6);
              std::ostream::_M_insert<unsigned_long>((ulong)&(local_148.data_)->line);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&(local_148.data_)->line," had unexpected height",0x16);
              pSVar4 = "";
              if ((undefined8 *)CONCAT71(local_138._9_7_,local_138[8]) != (undefined8 *)0x0) {
                pSVar4 = *(SEARCH_METHODS **)CONCAT71(local_138._9_7_,local_138[8]);
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_140,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                         ,0x2e3,(char *)pSVar4);
              testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_148);
              testing::internal::AssertHelper::~AssertHelper(&local_140);
              if (local_148.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_148.data_ + 8))();
              }
            }
            puVar2 = (undefined8 *)CONCAT71(local_138._9_7_,local_138[8]);
            if (puVar2 != (undefined8 *)0x0) {
              if ((undefined8 *)*puVar2 != puVar2 + 2) {
                operator_delete((undefined8 *)*puVar2);
              }
              operator_delete(puVar2);
            }
            local_148.data_ = local_148.data_ & 0xffffffff00000000;
            local_140.data_._0_4_ = (this->super_ResizeRealtimeTest).mismatch_nframes_;
            testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                      ((internal *)local_138,"static_cast<unsigned int>(0)","GetMismatchFrames()",
                       (uint *)&local_148,(uint *)&local_140);
            if (local_138[0] == (string)0x0) {
              testing::Message::Message((Message *)&local_148);
              pSVar4 = "";
              if ((undefined8 *)CONCAT71(local_138._9_7_,local_138[8]) != (undefined8 *)0x0) {
                pSVar4 = *(SEARCH_METHODS **)CONCAT71(local_138._9_7_,local_138[8]);
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_140,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                         ,0x2e5,(char *)pSVar4);
              testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_148);
              testing::internal::AssertHelper::~AssertHelper(&local_140);
              if (local_148.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_148.data_ + 8))();
              }
            }
            puVar2 = (undefined8 *)CONCAT71(local_138._9_7_,local_138[8]);
            if (puVar2 != (undefined8 *)0x0) {
              if ((undefined8 *)*puVar2 != puVar2 + 2) {
                operator_delete((undefined8 *)*puVar2);
              }
              operator_delete(puVar2);
            }
            pFVar5 = pFVar5 + 1;
          } while (pFVar5 != local_110);
        }
      }
      goto LAB_0066e1c4;
    }
  }
  testing::Message::Message((Message *)local_138);
  testing::internal::AssertHelper::AssertHelper
            (&local_148,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
             ,0x2d5,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_148,(Message *)local_138);
  testing::internal::AssertHelper::~AssertHelper(&local_148);
  if ((long *)local_138._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_138._0_8_ + 8))();
  }
LAB_0066e1c4:
  libaom_test::Y4mVideoSource::~Y4mVideoSource(&local_108);
  return;
}

Assistant:

TEST_P(ResizeRealtimeTest, TestInternalResizeSetScaleMode3) {
  ::libaom_test::Y4mVideoSource video("niklas_1280_720_30.y4m", 0, 60);
  cfg_.g_w = 1280;
  cfg_.g_h = 720;
  set_scale_mode_ = false;
  set_scale_mode2_ = false;
  set_scale_mode3_ = true;
  DefaultConfig();
  change_bitrate_ = false;
  mismatch_nframes_ = 0;
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
#if CONFIG_AV1_DECODER
  // Check we decoded the same number of frames as we attempted to encode
  ASSERT_EQ(frame_info_list_.size(), video.limit());
  for (const auto &info : frame_info_list_) {
    const auto frame = static_cast<unsigned>(info.pts);
    unsigned int expected_w = 640;
    unsigned int expected_h = 720;
    if (frame > 30) {
      expected_w = 1280;
      expected_h = 720;
    }
    EXPECT_EQ(expected_w, info.w)
        << "Frame " << frame << " had unexpected width";
    EXPECT_EQ(expected_h, info.h)
        << "Frame " << frame << " had unexpected height";
    EXPECT_EQ(static_cast<unsigned int>(0), GetMismatchFrames());
  }
#else
  printf("Warning: AV1 decoder unavailable, unable to check resize count!\n");
#endif
}